

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_binary_op.cxx
# Opt level: O0

void __thiscall HAXX_BINARY_OP::quaternion_binary_add::test_method(quaternion_binary_add *this)

{
  undefined8 uVar1;
  bool bVar2;
  double dVar3;
  quaternion<double> r;
  quaternion<double> p;
  quaternion<double> q;
  char *in_stack_fffffffffffff6b8;
  quaternion<double> *in_stack_fffffffffffff6c0;
  char *in_stack_fffffffffffff6c8;
  undefined1 local_630 [32];
  undefined1 local_610 [40];
  undefined1 local_5e8 [16];
  basic_cstring<const_char> local_5d8;
  double local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [40];
  undefined1 local_578 [16];
  basic_cstring<const_char> local_568;
  double local_558;
  undefined1 local_550 [32];
  undefined1 local_530 [40];
  undefined1 local_508 [16];
  basic_cstring<const_char> local_4f8;
  double local_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [40];
  undefined1 local_498 [16];
  basic_cstring<const_char> local_488;
  double local_478;
  undefined1 local_470 [32];
  undefined1 local_450 [40];
  undefined1 local_428 [16];
  basic_cstring<const_char> local_418;
  double local_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [40];
  undefined1 local_3b8 [16];
  basic_cstring<const_char> local_3a8;
  double local_398;
  undefined1 local_390 [32];
  undefined1 local_370 [40];
  undefined1 local_348 [16];
  basic_cstring<const_char> local_338;
  double local_328;
  undefined1 local_320 [32];
  undefined1 local_300 [40];
  undefined1 local_2d8 [16];
  basic_cstring<const_char> local_2c8;
  double local_2b8;
  undefined1 local_2b0 [32];
  undefined1 local_290 [40];
  undefined1 local_268 [16];
  basic_cstring<const_char> local_258;
  double local_248;
  undefined1 local_240 [32];
  undefined1 local_220 [40];
  undefined1 local_1f8 [16];
  basic_cstring<const_char> local_1e8;
  double local_1d8;
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [40];
  undefined1 local_188 [16];
  basic_cstring<const_char> local_178;
  double local_168;
  quaternion<double> local_160;
  basic_cstring<const_char> local_140;
  undefined1 local_130 [40];
  undefined1 local_108 [16];
  basic_cstring<const_char> local_f8;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  quaternion<double> local_a8;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  quaternion<double> local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  local_70 = -5.0;
  local_78 = 6.94;
  local_80 = 7.82;
  local_88 = -8.0;
  HAXX::quaternion<double>::quaternion(&local_68,&local_70,&local_78,&local_80,&local_88);
  local_b0 = 0.0;
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  HAXX::quaternion<double>::quaternion(&local_a8,&local_b0,&local_b8,&local_c0,&local_c8);
  HAXX::operator+(in_stack_fffffffffffff6c0,(quaternion<double> *)in_stack_fffffffffffff6b8);
  local_a8._M_real = local_e8;
  local_a8._M_imag_i = local_e0;
  local_a8._M_imag_j = local_d8;
  local_a8._M_imag_k = local_d0;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0xd5,local_108);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_160._M_imag_i = HAXX::quaternion<double>::real(&local_a8);
    dVar3 = HAXX::quaternion<double>::real(&local_68);
    local_160._M_real = HAXX::quaternion<double>::real(&local_28);
    local_160._M_real = dVar3 + local_160._M_real;
    local_168 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "p.real() + q.real()";
    in_stack_fffffffffffff6c0 = &local_160;
    in_stack_fffffffffffff6b8 = "r.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_130,&local_140,0xd5,1,8,&local_160._M_imag_i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19e74b);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0xd6,local_188);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1d0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_1d0._8_8_ = HAXX::quaternion<double>::imag_i(&local_a8);
    dVar3 = HAXX::quaternion<double>::imag_i(&local_68);
    local_1d0._0_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_1d0._0_8_ = dVar3 + (double)local_1d0._0_8_;
    local_1d8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "p.imag_i() + q.imag_i()";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_1d0;
    in_stack_fffffffffffff6b8 = "r.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_1b0,local_1d0 + 0x10,0xd6,1,8,local_1d0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19e926);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0xd7,local_1f8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_240 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_240._8_8_ = HAXX::quaternion<double>::imag_j(&local_a8);
    dVar3 = HAXX::quaternion<double>::imag_j(&local_68);
    local_240._0_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_240._0_8_ = dVar3 + (double)local_240._0_8_;
    local_248 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "p.imag_j() + q.imag_j()";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_240;
    in_stack_fffffffffffff6b8 = "r.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_220,local_240 + 0x10,0xd7,1,8,local_240 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19eb01);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0xd8,local_268);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2b0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_2b0._8_8_ = HAXX::quaternion<double>::imag_k(&local_a8);
    dVar3 = HAXX::quaternion<double>::imag_k(&local_68);
    local_2b0._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_2b0._0_8_ = dVar3 + (double)local_2b0._0_8_;
    local_2b8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "p.imag_k() + q.imag_k()";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_2b0;
    in_stack_fffffffffffff6b8 = "r.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_290,local_2b0 + 0x10,0xd8,1,8,local_2b0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19ecdc);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2c8,0xda,local_2d8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_320 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_320._8_8_ = HAXX::quaternion<double>::real(&local_28);
    local_320._0_8_ = 1.0;
    local_328 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "1.";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_320;
    in_stack_fffffffffffff6b8 = "q.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_300,local_320 + 0x10,0xda,1,8,local_320 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19ee7a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_338,0xdb,local_348);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_390 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_390._8_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_390._0_8_ = 2.0;
    local_398 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "2.";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_390;
    in_stack_fffffffffffff6b8 = "q.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_370,local_390 + 0x10,0xdb,1,8,local_390 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19f018);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a8,0xdc,local_3b8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_400 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_400._8_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_400._0_8_ = 3.0;
    local_408 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "3.";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_400;
    in_stack_fffffffffffff6b8 = "q.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_3e0,local_400 + 0x10,0xdc,1,8,local_400 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19f1b6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_418,0xdd,local_428);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_470 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_470._8_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_470._0_8_ = 4.0;
    local_478 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "4.";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_470;
    in_stack_fffffffffffff6b8 = "q.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_450,local_470 + 0x10,0xdd,1,8,local_470 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19f354);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_488,0xdf,local_498);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4e0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_4e0._8_8_ = HAXX::quaternion<double>::real(&local_68);
    local_4e0._0_8_ = -5.0;
    local_4e8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "-5.";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_4e0;
    in_stack_fffffffffffff6b8 = "p.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_4c0,local_4e0 + 0x10,0xdf,1,8,local_4e0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19f4f2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4f8,0xe0,local_508);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_550 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_550._8_8_ = HAXX::quaternion<double>::imag_i(&local_68);
    local_550._0_8_ = 6.94;
    local_558 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "6.94";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_550;
    in_stack_fffffffffffff6b8 = "p.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_530,local_550 + 0x10,0xe0,1,8,local_550 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19f690);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_568,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_568,0xe1,local_578);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_5c0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_5c0._8_8_ = HAXX::quaternion<double>::imag_j(&local_68);
    local_5c0._0_8_ = 7.82;
    local_5c8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "7.82";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_5c0;
    in_stack_fffffffffffff6b8 = "p.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_5a0,local_5c0 + 0x10,0xe1,1,8,local_5c0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19f81c);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5d8,0xe2,local_5e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff6c8,(char (*) [1])in_stack_fffffffffffff6c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_630 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_630._8_8_ = HAXX::quaternion<double>::imag_k(&local_68);
    local_630._0_8_ = -8.0;
    boost::math::fpc::percent_tolerance<double>((double)in_stack_fffffffffffff6b8);
    in_stack_fffffffffffff6c8 = "-8.";
    in_stack_fffffffffffff6c0 = (quaternion<double> *)local_630;
    in_stack_fffffffffffff6b8 = "p.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_610,local_630 + 0x10,0xe2,1,8,local_630 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19f990);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_binary_add)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p(-5.,6.94,7.82,-8.),r;
  r = p + q;

  BOOST_CHECK_CLOSE(r.real()  ,p.real()   + q.real()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_i(),p.imag_i() + q.imag_i(), COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_j(),p.imag_j() + q.imag_j(), COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_k(),p.imag_k() + q.imag_k(), COMPARE_TOL);

  BOOST_CHECK_CLOSE(q.real(),1.  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_i(),2., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_j(),3., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_k(),4., COMPARE_TOL);

  BOOST_CHECK_CLOSE(p.real()  ,-5. , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_i(),6.94, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_j(),7.82, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_k(),-8. , COMPARE_TOL);


}